

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform_pack4.h
# Opt level: O0

void ncnn::conv3x3s1_winograd43_transform_output_pack4_sse
               (Mat *top_blob_tm,Mat *top_blob,Mat *bias,Option *opt)

{
  int iVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  undefined8 *puVar19;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m128 _out03;
  __m128 _out02;
  __m128 _out01;
  __m128 _out00;
  __m128 _tmp13b_1;
  __m128 _tmp02b_1;
  __m128 _tmp13a_1;
  __m128 _tmp02a_1;
  __m128 _tmp05;
  __m128 _tmp04;
  __m128 _tmp03;
  __m128 _tmp02;
  __m128 _tmp01;
  __m128 _tmp00;
  int m_3;
  __m128 _tmp3m;
  __m128 _tmp2m;
  __m128 _tmp1m;
  __m128 _tmp0m;
  __m128 _tmp13b;
  __m128 _tmp02b;
  __m128 _tmp13a;
  __m128 _tmp02a;
  __m128 _out0tm5;
  __m128 _out0tm4;
  __m128 _out0tm3;
  __m128 _out0tm2;
  __m128 _out0tm1;
  __m128 _out0tm0;
  int m_2;
  float *output0;
  float *output0_tm_5;
  float *output0_tm_4;
  float *output0_tm_3;
  float *output0_tm_2;
  float *output0_tm_1;
  float *output0_tm_0;
  int j;
  int i;
  __m128 _v8;
  __m128 _v4;
  __m128 _v2;
  float tmp [4] [6] [4];
  __m128 _bias0;
  Mat out0;
  Mat out0_tm;
  int p;
  float *biasptr;
  int tiles;
  int h_tiles;
  int w_tiles;
  int outch;
  int outh;
  int outw;
  Mat *m_1;
  Mat *m;
  undefined8 local_d68;
  undefined8 uStack_d60;
  int local_c3c;
  int local_b4c;
  undefined8 *local_b48;
  undefined8 *local_b40;
  undefined1 (*local_b38) [16];
  undefined1 (*local_b30) [16];
  undefined1 (*local_b28) [16];
  undefined1 (*local_b20) [16];
  undefined8 *local_b18;
  int local_b10;
  int local_b0c;
  undefined8 local_ad8 [52];
  long local_938;
  undefined8 local_930;
  long local_928;
  undefined4 local_920;
  long local_918;
  int local_90c;
  undefined4 local_908;
  undefined4 local_904;
  undefined4 local_900;
  long local_8f0;
  undefined8 local_8e8;
  long local_8e0;
  undefined4 local_8d8;
  long local_8d0;
  undefined4 local_8c4;
  undefined4 local_8c0;
  undefined4 local_8bc;
  undefined4 local_8b8;
  int local_8a4;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar15 = in_RSI[7];
  iVar16 = iVar1 / 4;
  iVar17 = (int)in_RSI[6] / 4;
  iVar18 = iVar16 * iVar17;
  lVar2 = *in_RDX;
  for (local_8a4 = 0; local_8a4 < (int)lVar15; local_8a4 = local_8a4 + 1) {
    local_8f0 = *in_RDI + in_RDI[8] * (long)local_8a4 * in_RDI[2];
    local_8e8 = 0;
    local_8e0 = in_RDI[2];
    local_8d8 = (int)in_RDI[3];
    local_8d0 = in_RDI[4];
    local_8c4 = *(undefined4 *)((long)in_RDI + 0x2c);
    local_8c0 = (int)in_RDI[6];
    local_8bc = 1;
    local_8b8 = *(undefined4 *)((long)in_RDI + 0x34);
    local_90c = *(int *)((long)in_RSI + 0x2c);
    local_938 = *in_RSI + in_RSI[8] * (long)local_8a4 * in_RSI[2];
    local_928 = in_RSI[2];
    local_930 = 0;
    local_920 = (int)in_RSI[3];
    local_918 = in_RSI[4];
    local_908 = (int)in_RSI[6];
    local_904 = 1;
    local_900 = *(undefined4 *)((long)in_RSI + 0x34);
    if (lVar2 == 0) {
      local_d68 = 0;
      uStack_d60 = 0;
    }
    else {
      puVar19 = (undefined8 *)(lVar2 + (long)(local_8a4 << 2) * 4);
      local_d68 = *puVar19;
      uStack_d60 = puVar19[1];
    }
    local_ad8[0x30] = local_d68;
    for (local_b0c = 0; local_b0c < iVar17; local_b0c = local_b0c + 1) {
      for (local_b10 = 0; local_b10 < iVar16; local_b10 = local_b10 + 1) {
        local_b18 = (undefined8 *)(local_8f0 + (long)((local_b0c * iVar16 + local_b10) * 4) * 4);
        local_b20 = (undefined1 (*) [16])((long)local_b18 + (long)(iVar18 * 4) * 4);
        local_b28 = (undefined1 (*) [16])((long)local_b18 + (long)(iVar18 * 8) * 4);
        local_b30 = (undefined1 (*) [16])((long)local_b18 + (long)(iVar18 * 0xc) * 4);
        local_b38 = (undefined1 (*) [16])((long)local_b18 + (long)(iVar18 * 0x10) * 4);
        local_b40 = (undefined8 *)((long)local_b18 + (long)(iVar18 * 0x14) * 4);
        local_b48 = (undefined8 *)
                    (local_938 + (long)local_90c * (long)(local_b0c << 2) * local_928 +
                    (long)(local_b10 << 4) * 4);
        for (local_b4c = 0; local_b4c < 6; local_b4c = local_b4c + 1) {
          local_438 = (float)*(undefined8 *)*local_b20;
          fStack_434 = (float)((ulong)*(undefined8 *)*local_b20 >> 0x20);
          fStack_430 = (float)*(undefined8 *)(*local_b20 + 8);
          fStack_42c = (float)((ulong)*(undefined8 *)(*local_b20 + 8) >> 0x20);
          local_448 = (float)*(undefined8 *)*local_b28;
          fStack_444 = (float)((ulong)*(undefined8 *)*local_b28 >> 0x20);
          fStack_440 = (float)*(undefined8 *)(*local_b28 + 8);
          fStack_43c = (float)((ulong)*(undefined8 *)(*local_b28 + 8) >> 0x20);
          auVar3 = vsubps_avx(*local_b20,*local_b28);
          local_458 = (float)*(undefined8 *)*local_b30;
          fStack_454 = (float)((ulong)*(undefined8 *)*local_b30 >> 0x20);
          fStack_450 = (float)*(undefined8 *)(*local_b30 + 8);
          fStack_44c = (float)((ulong)*(undefined8 *)(*local_b30 + 8) >> 0x20);
          local_468 = (float)*(undefined8 *)*local_b38;
          fStack_464 = (float)((ulong)*(undefined8 *)*local_b38 >> 0x20);
          fStack_460 = (float)*(undefined8 *)(*local_b38 + 8);
          fStack_45c = (float)((ulong)*(undefined8 *)(*local_b38 + 8) >> 0x20);
          auVar4 = vsubps_avx(*local_b30,*local_b38);
          local_478 = (float)*local_b18;
          fStack_474 = (float)((ulong)*local_b18 >> 0x20);
          fStack_470 = (float)local_b18[1];
          fStack_46c = (float)((ulong)local_b18[1] >> 0x20);
          local_248 = auVar4._0_4_;
          fStack_244 = auVar4._4_4_;
          fStack_240 = auVar4._8_4_;
          fStack_23c = auVar4._12_4_;
          local_268 = auVar3._0_4_;
          fStack_264 = auVar3._4_4_;
          fStack_260 = auVar3._8_4_;
          fStack_25c = auVar3._12_4_;
          local_4b8 = (float)*local_b40;
          fStack_4b4 = (float)((ulong)*local_b40 >> 0x20);
          fStack_4b0 = (float)local_b40[1];
          fStack_4ac = (float)((ulong)local_b40[1] >> 0x20);
          local_ad8[(long)local_b4c * 2] =
               CONCAT44(fStack_474 + fStack_434 + fStack_444 + fStack_454 + fStack_464,
                        local_478 + local_438 + local_448 + local_458 + local_468);
          local_ad8[(long)local_b4c * 2 + 1] =
               CONCAT44(fStack_46c + fStack_42c + fStack_43c + fStack_44c + fStack_45c,
                        fStack_470 + fStack_430 + fStack_440 + fStack_450 + fStack_460);
          local_ad8[(long)local_b4c * 2 + 0xc] =
               CONCAT44(fStack_244 * 2.0 + fStack_264,local_248 * 2.0 + local_268);
          local_ad8[(long)local_b4c * 2 + 0xd] =
               CONCAT44(fStack_23c * 2.0 + fStack_25c,fStack_240 * 2.0 + fStack_260);
          local_ad8[(long)local_b4c * 2 + 0x18] =
               CONCAT44((fStack_454 + fStack_464) * 4.0 + fStack_434 + fStack_444,
                        (local_458 + local_468) * 4.0 + local_438 + local_448);
          local_ad8[(long)local_b4c * 2 + 0x19] =
               CONCAT44((fStack_44c + fStack_45c) * 4.0 + fStack_42c + fStack_43c,
                        (fStack_450 + fStack_460) * 4.0 + fStack_430 + fStack_440);
          local_ad8[(long)local_b4c * 2 + 0x24] =
               CONCAT44(fStack_244 * 8.0 + fStack_4b4 + fStack_264,
                        local_248 * 8.0 + local_4b8 + local_268);
          local_ad8[(long)local_b4c * 2 + 0x25] =
               CONCAT44(fStack_23c * 8.0 + fStack_4ac + fStack_25c,
                        fStack_240 * 8.0 + fStack_4b0 + fStack_260);
          local_b18 = (undefined8 *)((long)local_b18 + (long)(iVar18 * 0x18) * 4);
          local_b20 = (undefined1 (*) [16])(*local_b20 + (long)(iVar18 * 0x18) * 4);
          local_b28 = (undefined1 (*) [16])(*local_b28 + (long)(iVar18 * 0x18) * 4);
          local_b30 = (undefined1 (*) [16])(*local_b30 + (long)(iVar18 * 0x18) * 4);
          local_b38 = (undefined1 (*) [16])(*local_b38 + (long)(iVar18 * 0x18) * 4);
          local_b40 = (undefined8 *)((long)local_b40 + (long)(iVar18 * 0x18) * 4);
        }
        for (local_c3c = 0; local_c3c < 4; local_c3c = local_c3c + 1) {
          uVar5 = local_ad8[(long)local_c3c * 0xc + 2];
          uVar6 = local_ad8[(long)local_c3c * 0xc + 3];
          uVar7 = local_ad8[(long)local_c3c * 0xc + 4];
          uVar8 = local_ad8[(long)local_c3c * 0xc + 5];
          uVar9 = local_ad8[(long)local_c3c * 0xc + 6];
          uVar10 = local_ad8[(long)local_c3c * 0xc + 7];
          uVar11 = local_ad8[(long)local_c3c * 0xc + 8];
          uVar12 = local_ad8[(long)local_c3c * 0xc + 9];
          local_4d8 = (float)uVar5;
          fStack_4d4 = (float)((ulong)uVar5 >> 0x20);
          fStack_4d0 = (float)uVar6;
          fStack_4cc = (float)((ulong)uVar6 >> 0x20);
          local_4e8 = (float)uVar7;
          fStack_4e4 = (float)((ulong)uVar7 >> 0x20);
          fStack_4e0 = (float)uVar8;
          fStack_4dc = (float)((ulong)uVar8 >> 0x20);
          auVar14._8_8_ = uVar6;
          auVar14._0_8_ = uVar5;
          auVar3._8_8_ = uVar8;
          auVar3._0_8_ = uVar7;
          auVar3 = vsubps_avx(auVar14,auVar3);
          local_4f8 = (float)uVar9;
          fStack_4f4 = (float)((ulong)uVar9 >> 0x20);
          fStack_4f0 = (float)uVar10;
          fStack_4ec = (float)((ulong)uVar10 >> 0x20);
          local_508 = (float)uVar11;
          fStack_504 = (float)((ulong)uVar11 >> 0x20);
          fStack_500 = (float)uVar12;
          fStack_4fc = (float)((ulong)uVar12 >> 0x20);
          auVar13._8_8_ = uVar10;
          auVar13._0_8_ = uVar9;
          auVar4._8_8_ = uVar12;
          auVar4._0_8_ = uVar11;
          auVar4 = vsubps_avx(auVar13,auVar4);
          local_518 = (float)local_ad8[(long)local_c3c * 0xc];
          fStack_514 = (float)((ulong)local_ad8[(long)local_c3c * 0xc] >> 0x20);
          fStack_510 = (float)local_ad8[(long)local_c3c * 0xc + 1];
          fStack_50c = (float)((ulong)local_ad8[(long)local_c3c * 0xc + 1] >> 0x20);
          local_558 = (float)local_ad8[0x30];
          fStack_554 = (float)((ulong)local_ad8[0x30] >> 0x20);
          fStack_550 = (float)uStack_d60;
          fStack_54c = (float)((ulong)uStack_d60 >> 0x20);
          local_1e8 = auVar4._0_4_;
          fStack_1e4 = auVar4._4_4_;
          fStack_1e0 = auVar4._8_4_;
          fStack_1dc = auVar4._12_4_;
          local_358 = auVar3._0_4_;
          fStack_354 = auVar3._4_4_;
          fStack_350 = auVar3._8_4_;
          fStack_34c = auVar3._12_4_;
          local_5b8 = (float)local_ad8[(long)local_c3c * 0xc + 10];
          fStack_5b4 = (float)((ulong)local_ad8[(long)local_c3c * 0xc + 10] >> 0x20);
          fStack_5b0 = (float)local_ad8[(long)local_c3c * 0xc + 0xb];
          fStack_5ac = (float)((ulong)local_ad8[(long)local_c3c * 0xc + 0xb] >> 0x20);
          *local_b48 = CONCAT44(fStack_554 +
                                fStack_514 + fStack_4d4 + fStack_4e4 + fStack_4f4 + fStack_504,
                                local_558 +
                                local_518 + local_4d8 + local_4e8 + local_4f8 + local_508);
          local_b48[1] = CONCAT44(fStack_54c +
                                  fStack_50c + fStack_4cc + fStack_4dc + fStack_4ec + fStack_4fc,
                                  fStack_550 +
                                  fStack_510 + fStack_4d0 + fStack_4e0 + fStack_4f0 + fStack_500);
          local_b48[2] = CONCAT44(fStack_554 + fStack_1e4 * 2.0 + fStack_354,
                                  local_558 + local_1e8 * 2.0 + local_358);
          local_b48[3] = CONCAT44(fStack_54c + fStack_1dc * 2.0 + fStack_34c,
                                  fStack_550 + fStack_1e0 * 2.0 + fStack_350);
          local_b48[4] = CONCAT44(fStack_554 +
                                  (fStack_4f4 + fStack_504) * 4.0 + fStack_4d4 + fStack_4e4,
                                  local_558 + (local_4f8 + local_508) * 4.0 + local_4d8 + local_4e8)
          ;
          local_b48[5] = CONCAT44(fStack_54c +
                                  (fStack_4ec + fStack_4fc) * 4.0 + fStack_4cc + fStack_4dc,
                                  fStack_550 +
                                  (fStack_4f0 + fStack_500) * 4.0 + fStack_4d0 + fStack_4e0);
          local_b48[6] = CONCAT44(fStack_554 + fStack_1e4 * 8.0 + fStack_5b4 + fStack_354,
                                  local_558 + local_1e8 * 8.0 + local_5b8 + local_358);
          local_b48[7] = CONCAT44(fStack_54c + fStack_1dc * 8.0 + fStack_5ac + fStack_34c,
                                  fStack_550 + fStack_1e0 * 8.0 + fStack_5b0 + fStack_350);
          local_b48 = (undefined8 *)((long)local_b48 + (long)(iVar1 << 2) * 4);
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_output_pack4_sse(const Mat& top_blob_tm, Mat& top_blob, const Mat& bias, const Option& opt)
{
    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int w_tiles = outw / 4;
    const int h_tiles = outh / 4;
    const int tiles = w_tiles * h_tiles;

    const float* biasptr = bias;

    // const float otm[4][6] = {
    //     {1.0f, 1.0f,  1.0f, 1.0f,  1.0f, 0.0f},
    //     {0.0f, 1.0f, -1.0f, 2.0f, -2.0f, 0.0f},
    //     {0.0f, 1.0f,  1.0f, 4.0f,  4.0f, 0.0f},
    //     {0.0f, 1.0f, -1.0f, 8.0f, -8.0f, 1.0f}
    // };

    // 0 = r00 + (r01 + r02) + (r03 + r04)
    // 1 =       (r01 - r02) + (r03 - r04) * 2
    // 2 =       (r01 + r02) + (r03 + r04) * 4
    // 3 = r05 + (r01 - r02) + (r03 - r04) * 8

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        const Mat out0_tm = top_blob_tm.channel(p);
        Mat out0 = top_blob.channel(p);

        __m128 _bias0 = biasptr ? _mm_loadu_ps(biasptr + p * 4) : _mm_setzero_ps();

#ifdef _MSC_VER
        __declspec(align(16))
#else
        __attribute__((aligned(16)))
#endif
        float tmp[4][6][4];

        __m128 _v2 = _mm_set1_ps(2.f);
        __m128 _v4 = _mm_set1_ps(4.f);
        __m128 _v8 = _mm_set1_ps(8.f);

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* output0_tm_0 = (const float*)out0_tm + (i * w_tiles + j) * 4;
                const float* output0_tm_1 = output0_tm_0 + tiles * 4;
                const float* output0_tm_2 = output0_tm_0 + tiles * 4 * 2;
                const float* output0_tm_3 = output0_tm_0 + tiles * 4 * 3;
                const float* output0_tm_4 = output0_tm_0 + tiles * 4 * 4;
                const float* output0_tm_5 = output0_tm_0 + tiles * 4 * 5;

                float* output0 = out0.row(i * 4) + (j * 4) * 4;

                for (int m = 0; m < 6; m++)
                {
                    __m128 _out0tm0 = _mm_load_ps(output0_tm_0);
                    __m128 _out0tm1 = _mm_load_ps(output0_tm_1);
                    __m128 _out0tm2 = _mm_load_ps(output0_tm_2);
                    __m128 _out0tm3 = _mm_load_ps(output0_tm_3);
                    __m128 _out0tm4 = _mm_load_ps(output0_tm_4);
                    __m128 _out0tm5 = _mm_load_ps(output0_tm_5);

                    __m128 _tmp02a = _mm_add_ps(_out0tm1, _out0tm2);
                    __m128 _tmp13a = _mm_sub_ps(_out0tm1, _out0tm2);

                    __m128 _tmp02b = _mm_add_ps(_out0tm3, _out0tm4);
                    __m128 _tmp13b = _mm_sub_ps(_out0tm3, _out0tm4);

                    __m128 _tmp0m = _mm_add_ps(_mm_add_ps(_out0tm0, _tmp02a), _tmp02b);
                    __m128 _tmp1m = _mm_comp_fmadd_ps(_v2, _tmp13b, _tmp13a);
                    __m128 _tmp2m = _mm_comp_fmadd_ps(_v4, _tmp02b, _tmp02a);
                    __m128 _tmp3m = _mm_comp_fmadd_ps(_v8, _tmp13b, _mm_add_ps(_out0tm5, _tmp13a));

                    _mm_store_ps(tmp[0][m], _tmp0m);
                    _mm_store_ps(tmp[1][m], _tmp1m);
                    _mm_store_ps(tmp[2][m], _tmp2m);
                    _mm_store_ps(tmp[3][m], _tmp3m);

                    output0_tm_0 += tiles * 4 * 6;
                    output0_tm_1 += tiles * 4 * 6;
                    output0_tm_2 += tiles * 4 * 6;
                    output0_tm_3 += tiles * 4 * 6;
                    output0_tm_4 += tiles * 4 * 6;
                    output0_tm_5 += tiles * 4 * 6;
                }

                for (int m = 0; m < 4; m++)
                {
                    __m128 _tmp00 = _mm_load_ps(tmp[m][0]);
                    __m128 _tmp01 = _mm_load_ps(tmp[m][1]);
                    __m128 _tmp02 = _mm_load_ps(tmp[m][2]);
                    __m128 _tmp03 = _mm_load_ps(tmp[m][3]);
                    __m128 _tmp04 = _mm_load_ps(tmp[m][4]);
                    __m128 _tmp05 = _mm_load_ps(tmp[m][5]);

                    __m128 _tmp02a = _mm_add_ps(_tmp01, _tmp02);
                    __m128 _tmp13a = _mm_sub_ps(_tmp01, _tmp02);

                    __m128 _tmp02b = _mm_add_ps(_tmp03, _tmp04);
                    __m128 _tmp13b = _mm_sub_ps(_tmp03, _tmp04);

                    __m128 _out00 = _mm_add_ps(_bias0, _mm_add_ps(_mm_add_ps(_tmp00, _tmp02a), _tmp02b));
                    __m128 _out01 = _mm_add_ps(_bias0, _mm_comp_fmadd_ps(_v2, _tmp13b, _tmp13a));
                    __m128 _out02 = _mm_add_ps(_bias0, _mm_comp_fmadd_ps(_v4, _tmp02b, _tmp02a));
                    __m128 _out03 = _mm_add_ps(_bias0, _mm_comp_fmadd_ps(_v8, _tmp13b, _mm_add_ps(_tmp05, _tmp13a)));

                    _mm_store_ps(output0, _out00);
                    _mm_store_ps(output0 + 4, _out01);
                    _mm_store_ps(output0 + 4 * 2, _out02);
                    _mm_store_ps(output0 + 4 * 3, _out03);

                    output0 += outw * 4;
                }
            }
        }
    }
}